

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void __thiscall google::LogMessage::LogStream::~LogStream(LogStream *this)

{
  ios_base *this_00;
  _func_int *p_Var1;
  
  p_Var1 = (this->super_ostream)._vptr_basic_ostream[-3];
  this_00 = (ios_base *)(&(this->super_ostream).field_0x58 + (long)p_Var1);
  *(undefined ***)(this_00 + -0x58) = &PTR__LogStream_0013fae0;
  *(undefined ***)this_00 = &PTR__LogStream_0013fb08;
  *(code **)(this_00 + -0x50) = __assert_fail;
  std::locale::~locale((locale *)(&(this->super_ostream).field_0x40 + (long)p_Var1));
  std::ios_base::~ios_base(this_00);
  operator_delete((_func_int *)((long)&(this->super_ostream)._vptr_basic_ostream + (long)p_Var1),
                  0x160);
  return;
}

Assistant:

class GOOGLE_GLOG_DLL_DECL LogStream : public std::ostream {
GLOG_MSVC_POP_WARNING()
  public:
    LogStream(char *buf, int len, uint64 ctr)
        : std::ostream(NULL),
          streambuf_(buf, len),
          ctr_(ctr),
          self_(this) {
      rdbuf(&streambuf_);
    }

    uint64 ctr() const { return ctr_; }
    void set_ctr(uint64 ctr) { ctr_ = ctr; }
    LogStream* self() const { return self_; }

    // Legacy std::streambuf methods.
    size_t pcount() const { return streambuf_.pcount(); }
    char* pbase() const { return streambuf_.pbase(); }
    char* str() const { return pbase(); }

  private:
    LogStream(const LogStream&);
    LogStream& operator=(const LogStream&);
    base_logging::LogStreamBuf streambuf_;
    uint64 ctr_;  // Counter hack (for the LOG_EVERY_X() macro)
    LogStream *self_;  // Consistency check hack
  }